

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approx_top_k.cpp
# Opt level: O0

void __thiscall
duckdb::InternalApproxTopKState::Initialize(InternalApproxTopKState *this,idx_t kval)

{
  uint64_t uVar1;
  _Head_base<0UL,_duckdb::ApproxTopKValue_*,_false> in_RSI;
  unique_ptr<duckdb::ApproxTopKValue[],_std::default_delete<duckdb::ApproxTopKValue>,_false> *in_RDI
  ;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *unaff_retaddr;
  idx_t filter_size;
  vector<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
  *in_stack_00000010;
  uint64_t in_stack_00000028;
  unique_ptr<duckdb::ApproxTopKValue[],_std::default_delete<duckdb::ApproxTopKValue>,_false>
  *in_stack_ffffffffffffffe0;
  unique_ptr<duckdb::ApproxTopKValue[],_std::default_delete<duckdb::ApproxTopKValue>,_false>
  *__new_size;
  
  in_RDI[0xe].
  super_unique_ptr<duckdb::ApproxTopKValue[],_std::default_delete<duckdb::ApproxTopKValue[]>_>._M_t.
  super___uniq_ptr_impl<duckdb::ApproxTopKValue,_std::default_delete<duckdb::ApproxTopKValue[]>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ApproxTopKValue_*,_std::default_delete<duckdb::ApproxTopKValue[]>_>
  .super__Head_base<0UL,_duckdb::ApproxTopKValue_*,_false>._M_head_impl = in_RSI._M_head_impl;
  in_RDI[0xf].
  super_unique_ptr<duckdb::ApproxTopKValue[],_std::default_delete<duckdb::ApproxTopKValue[]>_>._M_t.
  super___uniq_ptr_impl<duckdb::ApproxTopKValue,_std::default_delete<duckdb::ApproxTopKValue[]>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ApproxTopKValue_*,_std::default_delete<duckdb::ApproxTopKValue[]>_>
  .super__Head_base<0UL,_duckdb::ApproxTopKValue_*,_false>._M_head_impl = in_RSI._M_head_impl * 3;
  __new_size = in_RDI;
  make_unsafe_uniq_array_uninitialized<duckdb::ApproxTopKValue>(kval);
  unique_ptr<duckdb::ApproxTopKValue[],_std::default_delete<duckdb::ApproxTopKValue>,_false>::
  operator=(in_stack_ffffffffffffffe0,in_RDI);
  unique_ptr<duckdb::ApproxTopKValue[],_std::default_delete<duckdb::ApproxTopKValue>,_false>::
  ~unique_ptr((unique_ptr<duckdb::ApproxTopKValue[],_std::default_delete<duckdb::ApproxTopKValue>,_false>
               *)0x1ce5b80);
  ::std::
  vector<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
  ::reserve(in_stack_00000010,filter_size);
  uVar1 = NextPowerOfTwo(in_stack_00000028);
  in_RDI[0x10].
  super_unique_ptr<duckdb::ApproxTopKValue[],_std::default_delete<duckdb::ApproxTopKValue[]>_>._M_t.
  super___uniq_ptr_impl<duckdb::ApproxTopKValue,_std::default_delete<duckdb::ApproxTopKValue[]>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ApproxTopKValue_*,_std::default_delete<duckdb::ApproxTopKValue[]>_>
  .super__Head_base<0UL,_duckdb::ApproxTopKValue_*,_false>._M_head_impl =
       (ApproxTopKValue *)(uVar1 - 1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (unaff_retaddr,(size_type)__new_size);
  return;
}

Assistant:

void Initialize(idx_t kval) {
		static constexpr idx_t MONITORED_VALUES_RATIO = 3;
		static constexpr idx_t FILTER_RATIO = 8;

		D_ASSERT(values.empty());
		D_ASSERT(lookup_map.empty());
		k = kval;
		capacity = kval * MONITORED_VALUES_RATIO;
		stored_values = make_unsafe_uniq_array_uninitialized<ApproxTopKValue>(capacity);
		values.reserve(capacity);

		// we scale the filter based on the amount of values we are monitoring
		idx_t filter_size = NextPowerOfTwo(capacity * FILTER_RATIO);
		filter_mask = filter_size - 1;
		filter.resize(filter_size);
	}